

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_depset_all(ly_ctx *ctx,lys_glob_unres *unres)

{
  long lVar1;
  uint uVar2;
  LY_ERR LVar3;
  ulong uVar4;
  ulong uVar5;
  lyd_node *dep_set;
  
  if ((unres->dep_sets).count == 0) {
    return LY_SUCCESS;
  }
  uVar4 = 0;
  while( true ) {
    dep_set = (unres->dep_sets).field_2.dnodes[uVar4];
    uVar2 = dep_set->flags;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        lVar1 = *(long *)(dep_set->schema->hash + uVar5 * 8 + -4);
        if (*(char *)(lVar1 + 0x79) != '\0') {
          LVar3 = lys_check_features(*(lysp_module **)(lVar1 + 0x50));
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          uVar2 = dep_set->flags;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
      dep_set = (unres->dep_sets).field_2.dnodes[uVar4];
    }
    LVar3 = lys_compile_depset_r(ctx,(ly_set *)dep_set,unres);
    if (LVar3 != LY_SUCCESS) break;
    uVar4 = uVar4 + 1;
    if ((unres->dep_sets).count <= uVar4) {
      return LY_SUCCESS;
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
lys_compile_depset_all(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    uint32_t i;

    for (i = 0; i < unres->dep_sets.count; ++i) {
        LY_CHECK_RET(lys_compile_depset_check_features(unres->dep_sets.objs[i]));
        LY_CHECK_RET(lys_compile_depset_r(ctx, unres->dep_sets.objs[i], unres));
    }

    return LY_SUCCESS;
}